

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O2

int mbedtls_pem_write_buffer
              (char *header,char *footer,uchar *der_data,size_t der_len,uchar *buf,size_t buf_len,
              size_t *olen)

{
  ulong dlen;
  char *__s;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  uchar *dst;
  uchar *__src;
  uchar *__dest;
  uchar *puVar5;
  ulong local_40;
  char *local_38;
  
  mbedtls_base64_encode((uchar *)0x0,0,&local_40,der_data,der_len);
  sVar2 = strlen(header);
  local_38 = footer;
  sVar3 = strlen(footer);
  dlen = local_40;
  uVar4 = sVar3 + sVar2 + local_40 + (local_40 >> 6) + 1;
  if (buf_len < uVar4) {
    *olen = uVar4;
    iVar1 = -0x2a;
  }
  else {
    if (local_40 == 0) {
      dst = (uchar *)0x0;
    }
    else {
      dst = (uchar *)calloc(1,local_40);
      if (dst == (uchar *)0x0) {
        return -0x1180;
      }
    }
    iVar1 = mbedtls_base64_encode(dst,dlen,&local_40,der_data,der_len);
    if (iVar1 == 0) {
      sVar2 = strlen(header);
      memcpy(buf,header,sVar2);
      sVar2 = strlen(header);
      __dest = buf + sVar2;
      __src = dst;
      for (; __s = local_38, local_40 != 0; local_40 = local_40 - sVar2) {
        sVar2 = 0x40;
        if (local_40 < 0x40) {
          sVar2 = local_40;
        }
        memcpy(__dest,__src,sVar2);
        __src = __src + sVar2;
        puVar5 = __dest + sVar2;
        __dest = puVar5 + 1;
        *puVar5 = '\n';
      }
      sVar2 = strlen(local_38);
      memcpy(__dest,__s,sVar2);
      sVar2 = strlen(__s);
      __dest[sVar2] = '\0';
      *olen = (size_t)(__dest + (sVar2 - (long)buf) + 1);
      free(dst);
      iVar1 = 0;
    }
    else {
      free(dst);
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_pem_write_buffer( const char *header, const char *footer,
                      const unsigned char *der_data, size_t der_len,
                      unsigned char *buf, size_t buf_len, size_t *olen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *encode_buf = NULL, *c, *p = buf;
    size_t len = 0, use_len, add_len = 0;

    mbedtls_base64_encode( NULL, 0, &use_len, der_data, der_len );
    add_len = strlen( header ) + strlen( footer ) + ( use_len / 64 ) + 1;

    if( use_len + add_len > buf_len )
    {
        *olen = use_len + add_len;
        return( MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL );
    }

    if( use_len != 0 &&
        ( ( encode_buf = mbedtls_calloc( 1, use_len ) ) == NULL ) )
        return( MBEDTLS_ERR_PEM_ALLOC_FAILED );

    if( ( ret = mbedtls_base64_encode( encode_buf, use_len, &use_len, der_data,
                               der_len ) ) != 0 )
    {
        mbedtls_free( encode_buf );
        return( ret );
    }

    memcpy( p, header, strlen( header ) );
    p += strlen( header );
    c = encode_buf;

    while( use_len )
    {
        len = ( use_len > 64 ) ? 64 : use_len;
        memcpy( p, c, len );
        use_len -= len;
        p += len;
        c += len;
        *p++ = '\n';
    }

    memcpy( p, footer, strlen( footer ) );
    p += strlen( footer );

    *p++ = '\0';
    *olen = p - buf;

    mbedtls_free( encode_buf );
    return( 0 );
}